

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture2DShadowLodOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float lod;
  float *pfVar1;
  float fVar2;
  undefined1 local_20 [16];
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_20._8_8_ = p;
  p_local = (TexLookupParams *)c;
  pfVar1 = tcu::Vector<float,_4>::z(c->in);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(p_local + 1));
  s = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  t = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::x(&p_local[1].scale);
  lod = *pfVar1;
  tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)local_20,(int)local_20._8_8_ + 4,0);
  fVar2 = texture2DShadowOffset(c,fVar2,s,t,lod,(IVec2 *)local_20);
  pfVar1 = tcu::Vector<float,_4>::x(&p_local[10].scale);
  *pfVar1 = fVar2;
  return;
}

Assistant:

static void		evalTexture2DShadowLodOffset	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadowOffset(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), c.in[1].x(), p.offset.swizzle(0,1)); }